

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::IndexPropertyDescriptorMap::TryGetLastIndex(IndexPropertyDescriptorMap *this,uint32 *lastIndex)

{
  uint uVar1;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  code *pcVar3;
  undefined4 *puVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 unaff_R15;
  ulong uVar9;
  int local_5c;
  undefined4 *puStack_58;
  int i;
  uint32 *local_50;
  IndexPropertyDescriptor *local_48;
  IndexPropertyDescriptor *descriptor;
  uint32 local_38;
  uint local_34;
  
  pBVar2 = (this->indexPropertyMap).ptr;
  if (pBVar2->count == pBVar2->freeCount) {
    uVar9 = 0;
  }
  else {
    local_50 = lastIndex;
    EnsureIndexList(this);
    pBVar2 = (this->indexPropertyMap).ptr;
    iVar6 = pBVar2->count;
    uVar1 = pBVar2->freeCount;
    uVar7 = ~uVar1 + iVar6;
    uVar9 = CONCAT71((int7)((ulong)unaff_R15 >> 8),-1 < (int)uVar7);
    if (-1 < (int)uVar7) {
      puStack_58 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      iVar6 = iVar6 - uVar1;
      uVar8 = (ulong)uVar7;
      do {
        descriptor._4_4_ = (this->indexList).ptr[uVar8];
        local_38 = descriptor._4_4_;
        bVar5 = JsUtil::
                BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::TryGetReference<unsigned_int>
                          ((this->indexPropertyMap).ptr,(uint *)((long)&descriptor + 4),&local_48,
                           &local_5c);
        if ((!bVar5) || (local_48 == (IndexPropertyDescriptor *)0x0)) {
          local_34 = (uint)uVar9;
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = puStack_58;
          *puStack_58 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                      ,0x59,"(b && descriptor)","b && descriptor");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar4 = 0;
          uVar9 = (ulong)local_34;
        }
        if ((local_48->Attributes & 8) == 0) {
          *local_50 = local_38;
          break;
        }
        iVar6 = iVar6 + -1;
        uVar8 = uVar8 - 1;
        uVar9 = CONCAT71((int7)(uVar9 >> 8),0 < iVar6);
      } while (0 < iVar6);
    }
  }
  return (bool)((byte)uVar9 & 1);
}

Assistant:

bool IndexPropertyDescriptorMap::TryGetLastIndex(uint32* lastIndex)
    {
        if (Count() == 0)
        {
            return false;
        }

        EnsureIndexList();

        // Search the index list backwards for the last index
        for (int i = Count() - 1; i >= 0; i--)
        {
            uint32 key = indexList[i];

            IndexPropertyDescriptor* descriptor;
            bool b = TryGetReference(key, &descriptor);
            Assert(b && descriptor);

            if (!(descriptor->Attributes & PropertyDeleted))
            {
                *lastIndex = key;
                return true;
            }
        }

        return false;
    }